

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void google::protobuf::compiler::CodeGeneratorResponse_File::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *pAVar3;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar4;
  Arena *arena;
  
  pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  arena = pAVar3;
  if (((ulong)pAVar3 & 1) != 0) {
    arena = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar4 = from_msg;
    MergeImpl();
    pAVar3 = extraout_RDX;
LAB_0014c0fb:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
LAB_0014c022:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar4,value,pAVar3);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0xf) == 0) goto LAB_0014c0a6;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar4 = (MessageLite *)&to_msg[1]._internal_metadata_;
      if (((ulong)pAVar3 & 1) != 0) goto LAB_0014c0fb;
      goto LAB_0014c022;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pp_Var2 = from_msg[2]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 2),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar3
              );
  }
  if ((unaff_EBP & 4) != 0) {
    uVar1 = from_msg[2]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[2]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar3);
  }
  if ((unaff_EBP & 8) != 0) {
    pMVar4 = (MessageLite *)from_msg[3]._vptr_MessageLite;
    if (pMVar4 == (MessageLite *)0x0) {
      MergeImpl((CodeGeneratorResponse_File *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)
                Arena::CopyConstruct<google::protobuf::GeneratedCodeInfo>(arena,pMVar4);
      to_msg[3]._vptr_MessageLite = pp_Var2;
    }
    else {
      GeneratedCodeInfo::MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar4);
    }
  }
LAB_0014c0a6:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CodeGeneratorResponse_File*>(&to_msg);
  auto& from = static_cast<const CodeGeneratorResponse_File&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_insertion_point(from._internal_insertion_point());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_content(from._internal_content());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.generated_code_info_ != nullptr);
      if (_this->_impl_.generated_code_info_ == nullptr) {
        _this->_impl_.generated_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.generated_code_info_);
      } else {
        _this->_impl_.generated_code_info_->MergeFrom(*from._impl_.generated_code_info_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}